

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O3

void __thiscall hwnet::TCPConnector::~TCPConnector(TCPConnector *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Timer *this_00;
  _Manager_type p_Var3;
  _Atomic_word _Var4;
  int iVar5;
  bool bVar6;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_0012b8d0;
  (this->super_Channel)._vptr_Channel = (_func_int **)&DAT_0012b908;
  p_Var2 = (this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var4 = p_Var2->_M_use_count;
    do {
      if (_Var4 == 0) goto LAB_0011b6c4;
      LOCK();
      iVar5 = p_Var2->_M_use_count;
      bVar6 = _Var4 == iVar5;
      if (bVar6) {
        p_Var2->_M_use_count = _Var4 + 1;
        iVar5 = _Var4;
      }
      _Var4 = iVar5;
      UNLOCK();
    } while (!bVar6);
    this_00 = (this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00 != (Timer *)0x0 && p_Var2->_M_use_count != 0) {
      util::Timer::cancel(this_00);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
LAB_0011b6c4:
    p_Var2 = (this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var2->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var2->_M_weak_count;
        p_Var2->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var2->_vptr__Sp_counted_base[3])();
      }
    }
  }
  p_Var3 = (this->errorCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->errorCallback_,(_Any_data *)&this->errorCallback_,
              __destroy_functor);
  }
  p_Var3 = (this->connectCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->connectCallback_,(_Any_data *)&this->connectCallback_,
              __destroy_functor);
  }
  p_Var2 = (this->super_enable_shared_from_this<hwnet::TCPConnector>)._M_weak_this.
           super___weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

TCPConnector::~TCPConnector() {
	if(auto sp = this->connectTimer.lock()) {
		sp->cancel();
	}
}